

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

int __thiscall
jaegertracing::net::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  undefined4 in_register_00000034;
  IPAddress *this_01;
  ostringstream oss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  this_01 = (IPAddress *)CONCAT44(in_register_00000034,__fd);
  iVar1 = ::bind(this->_handle,(sockaddr *)this_01,this_01->_addrLen);
  if (iVar1 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failed to bind socket to address, addr=",0x27);
  IPAddress::print(this_01,(ostream *)local_198);
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  std::__cxx11::stringbuf::str();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar1,__ecat,&sStack_1b8);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void bind(const IPAddress& addr)
    {
        const auto returnCode =
            ::bind(_handle,
                   reinterpret_cast<const ::sockaddr*>(&addr.addr()),
                   addr.addrLen());
        if (returnCode != 0) {
            std::ostringstream oss;
            oss << "Failed to bind socket to address"
                   ", addr=";
            addr.print(oss);
            throw std::system_error(errno, std::system_category(), oss.str());
        }
    }